

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_append_ctx(void)

{
  int iVar1;
  int __fd;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  bool bVar5;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  bson_t child;
  bson_t expected;
  bson_t bcon;
  uint local_2c8;
  uint local_2ac;
  uint local_2a8;
  undefined1 local_280 [128];
  undefined1 local_200 [4];
  uint local_1fc;
  bson_t local_180 [2];
  
  bson_init(local_180);
  bson_init(local_200);
  bson_init(local_280);
  bson_append_utf8(local_280,"c",0xffffffff,"d");
  bson_append_utf8(local_280,"e",0xffffffff,"f");
  bson_append_document(local_200,"a",0xffffffff,local_280);
  test_append_ctx_helper(local_180,"a","{",0,"add magic","e","f","}",0);
  __buf = (void *)bson_get_data(local_180);
  __buf_00 = (void *)bson_get_data(local_200);
  local_2ac = 0xffffffff;
  bVar5 = true;
  if (local_1fc == local_180[0].len) {
    __s1 = (void *)bson_get_data(local_200);
    __s2 = (void *)bson_get_data(local_180);
    iVar1 = memcmp(__s1,__s2,(ulong)local_1fc);
    bVar5 = iVar1 != 0;
  }
  if (!bVar5) {
    bson_destroy(local_180);
    bson_destroy(local_200);
    bson_destroy(local_280);
    return;
  }
  uVar2 = bson_as_canonical_extended_json(local_180,0);
  uVar3 = bson_as_canonical_extended_json(local_200,0);
  local_2a8 = 0;
  do {
    if (local_180[0].len <= local_2a8 || local_1fc <= local_2a8) {
LAB_00146291:
      if (local_2ac == 0xffffffff) {
        if (local_180[0].len < local_1fc) {
          local_2c8 = local_1fc;
        }
        else {
          local_2c8 = local_180[0].len;
        }
        local_2ac = local_2c8 - 1;
      }
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_2ac,uVar2,uVar3);
      iVar1 = open("failure.bad.bson",0x42,0x1a0);
      __fd = open("failure.expected.bson",0x42,0x1a0);
      if (iVar1 == -1) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x271,"test_append_ctx","fd1 != -1");
        abort();
      }
      if (__fd == -1) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x271,"test_append_ctx","fd2 != -1");
        abort();
      }
      uVar4 = write(iVar1,__buf,(ulong)local_180[0].len);
      if (local_180[0].len != uVar4) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x271,"test_append_ctx","(&bcon)->len == bson_write (fd1, bson_data, (&bcon)->len)"
               );
        abort();
      }
      uVar4 = write(__fd,__buf_00,(ulong)local_1fc);
      if (local_1fc != uVar4) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x271,"test_append_ctx",
                "(&expected)->len == bson_write (fd2, expected_data, (&expected)->len)");
        abort();
      }
      close(iVar1);
      close(__fd);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
              ,0x271,"test_append_ctx","0");
      abort();
    }
    if (*(char *)((long)__buf + (ulong)local_2a8) != *(char *)((long)__buf_00 + (ulong)local_2a8)) {
      local_2ac = local_2a8;
      goto LAB_00146291;
    }
    local_2a8 = local_2a8 + 1;
  } while( true );
}

Assistant:

static void
test_append_ctx (void)
{
   bson_t bcon, expected, child;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);

   bson_append_utf8 (&child, "c", -1, "d", -1);
   bson_append_utf8 (&child, "e", -1, "f", -1);

   bson_append_document (&expected, "a", -1, &child);

   test_append_ctx_helper (
      &bcon, "a", "{", NULL, "add magic", "e", "f", "}", NULL);

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
   bson_destroy (&child);
}